

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O0

void Js::PropertyValueInfo::SetCacheInfo
               (PropertyValueInfo *info,RecyclableObject *prop,
               PropertyRecordUsageCache *propertyRecordUsageCache,
               PolymorphicInlineCache *polymorphicInlineCache,bool allowResizing)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptSymbol *this;
  PropertyString *this_00;
  PropertyRecordUsageCache *pPVar4;
  bool allowResizing_local;
  PolymorphicInlineCache *polymorphicInlineCache_local;
  PropertyRecordUsageCache *propertyRecordUsageCache_local;
  RecyclableObject *prop_local;
  PropertyValueInfo *info_local;
  
  if (info == (PropertyValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                ,0x1f,"(info)","info");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((prop != (RecyclableObject *)0x0) ||
     (propertyRecordUsageCache != (PropertyRecordUsageCache *)0x0)) {
    bVar2 = VarIs<Js::JavascriptSymbol,Js::RecyclableObject>(prop);
    if (bVar2) {
      this = UnsafeVarTo<Js::JavascriptSymbol,Js::RecyclableObject>(prop);
      pPVar4 = JavascriptSymbol::GetPropertyRecordUsageCache(this);
      if (pPVar4 == propertyRecordUsageCache) goto LAB_01434b73;
    }
    bVar2 = VarIs<Js::PropertyString,Js::RecyclableObject>(prop);
    if (bVar2) {
      this_00 = UnsafeVarTo<Js::PropertyString,Js::RecyclableObject>(prop);
      pPVar4 = PropertyString::GetPropertyRecordUsageCache(this_00);
      if (pPVar4 == propertyRecordUsageCache) goto LAB_01434b73;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                ,0x25,
                                "(prop == nullptr && propertyRecordUsageCache == nullptr || VarIs<JavascriptSymbol>(prop) && UnsafeVarTo<JavascriptSymbol>(prop)->GetPropertyRecordUsageCache() == propertyRecordUsageCache || VarIs<PropertyString>(prop) && UnsafeVarTo<PropertyString>(prop)->GetPropertyRecordUsageCache() == propertyRecordUsageCache)"
                                ,
                                "prop == nullptr && propertyRecordUsageCache == nullptr || VarIs<JavascriptSymbol>(prop) && UnsafeVarTo<JavascriptSymbol>(prop)->GetPropertyRecordUsageCache() == propertyRecordUsageCache || VarIs<PropertyString>(prop) && UnsafeVarTo<PropertyString>(prop)->GetPropertyRecordUsageCache() == propertyRecordUsageCache"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
LAB_01434b73:
  info->prop = prop;
  info->propertyRecordUsageCache = propertyRecordUsageCache;
  SetCacheInfo(info,polymorphicInlineCache,allowResizing);
  if ((propertyRecordUsageCache != (PropertyRecordUsageCache *)0x0) &&
     (bVar2 = PropertyRecordUsageCache::ShouldDisableWriteCache(propertyRecordUsageCache), bVar2)) {
    ClearInfoFlag(info,enableStoreFieldCacheFlag);
  }
  return;
}

Assistant:

void PropertyValueInfo::SetCacheInfo(
        _Out_ PropertyValueInfo* info,
        _In_opt_ RecyclableObject * prop,
        _In_opt_ PropertyRecordUsageCache *const propertyRecordUsageCache,
        _In_ PolymorphicInlineCache *const polymorphicInlineCache,
        bool allowResizing)
    {
        Assert(info);

        // Make sure the given prop and usage cache match
        Assert(
            prop == nullptr && propertyRecordUsageCache == nullptr ||
            VarIs<JavascriptSymbol>(prop) && UnsafeVarTo<JavascriptSymbol>(prop)->GetPropertyRecordUsageCache() == propertyRecordUsageCache ||
            VarIs<PropertyString>(prop) && UnsafeVarTo<PropertyString>(prop)->GetPropertyRecordUsageCache() == propertyRecordUsageCache);

        info->prop = prop;
        info->propertyRecordUsageCache = propertyRecordUsageCache;
        SetCacheInfo(info, polymorphicInlineCache, allowResizing);
        if (propertyRecordUsageCache && propertyRecordUsageCache->ShouldDisableWriteCache())
        {
            info->ClearInfoFlag(CacheInfoFlag::enableStoreFieldCacheFlag);
        }
    }